

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int is_single_newmv_valid(HandleInterModeArgs *args,MB_MODE_INFO *mbmi,PREDICTION_MODE this_mode)

{
  PREDICTION_MODE PVar1;
  PREDICTION_MODE in_DL;
  long in_RSI;
  long in_RDI;
  MV_REFERENCE_FRAME ref;
  PREDICTION_MODE single_mode;
  int ref_idx;
  int ref_idx_00;
  
  ref_idx_00 = 0;
  while( true ) {
    if (1 < ref_idx_00) {
      return 1;
    }
    PVar1 = get_single_mode(in_DL,ref_idx_00);
    if ((PVar1 == '\x10') &&
       (*(int *)(*(long *)(in_RDI + 0x60) +
                 (ulong)((byte)(*(ushort *)(in_RSI + 0xa7) >> 4) & 3) * 0x20 +
                (long)*(char *)(in_RSI + 0x10 + (long)ref_idx_00) * 4) == 0)) break;
    ref_idx_00 = ref_idx_00 + 1;
  }
  return 0;
}

Assistant:

static inline int is_single_newmv_valid(const HandleInterModeArgs *const args,
                                        const MB_MODE_INFO *const mbmi,
                                        PREDICTION_MODE this_mode) {
  for (int ref_idx = 0; ref_idx < 2; ++ref_idx) {
    const PREDICTION_MODE single_mode = get_single_mode(this_mode, ref_idx);
    const MV_REFERENCE_FRAME ref = mbmi->ref_frame[ref_idx];
    if (single_mode == NEWMV &&
        args->single_newmv_valid[mbmi->ref_mv_idx][ref] == 0) {
      return 0;
    }
  }
  return 1;
}